

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtils.cpp
# Opt level: O3

EmptyFileCreatorDisposer *
ApprovalTests::FileUtils::useEmptyFileCreator
          (EmptyFileCreatorDisposer *__return_storage_ptr__,EmptyFileCreator *creator)

{
  _Any_data local_30;
  _Manager_type local_20;
  
  ::std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)&local_30,creator);
  EmptyFileCreatorDisposer::EmptyFileCreatorDisposer
            (__return_storage_ptr__,(EmptyFileCreator *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

EmptyFileCreatorDisposer FileUtils::useEmptyFileCreator(EmptyFileCreator creator)
    {
        return EmptyFileCreatorDisposer(creator);
    }